

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CollectiveDipoleDisplacement.cpp
# Opt level: O0

void __thiscall
OpenMD::CollectiveDipoleDisplacement::CollectiveDipoleDisplacement
          (CollectiveDipoleDisplacement *this,SimInfo *info,string *filename,string *sele1,
          string *sele2)

{
  ostream *poVar1;
  TimeCorrFunc<OpenMD::Vector3<double>_> *this_00;
  Thermo *this_01;
  SystemACF<OpenMD::Vector3<double>_> *in_RDI;
  string labelString;
  stringstream label;
  string *in_stack_fffffffffffffd78;
  TimeCorrFunc<OpenMD::Vector3<double>_> *in_stack_fffffffffffffd80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd88;
  string *in_stack_fffffffffffffd90;
  SimInfo *in_stack_fffffffffffffd98;
  uint *__new_size;
  allocator<char> *__a;
  char *in_stack_fffffffffffffdb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdc0;
  stringstream local_228 [16];
  ostream local_218 [376];
  string local_a0 [32];
  string local_80 [55];
  allocator<char> local_49;
  string local_48 [72];
  
  SystemACF<OpenMD::Vector3<double>_>::SystemACF
            (in_RDI,in_stack_fffffffffffffd98,in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,
             (string *)in_stack_fffffffffffffd80);
  (in_RDI->super_AutoCorrFunc<OpenMD::Vector3<double>_>).
  super_TimeCorrFunc<OpenMD::Vector3<double>_>.super_DynamicProperty._vptr_DynamicProperty =
       (_func_int **)&PTR__CollectiveDipoleDisplacement_004e2000;
  std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::vector
            ((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)0x1384f1)
  ;
  std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::vector
            ((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)0x138507)
  ;
  __new_size = &in_RDI[1].super_AutoCorrFunc<OpenMD::Vector3<double>_>.
                super_TimeCorrFunc<OpenMD::Vector3<double>_>.nTimeBins_;
  std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::vector
            ((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)0x13851d)
  ;
  __a = &local_49;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,__a);
  TimeCorrFunc<OpenMD::Vector3<double>_>::setCorrFuncType
            (in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
  std::__cxx11::string::~string(local_48);
  std::allocator<char>::~allocator(&local_49);
  getPrefix(in_stack_fffffffffffffd88);
  std::operator+(in_stack_fffffffffffffd88,(char *)in_stack_fffffffffffffd80);
  DynamicProperty::setOutputName
            (&in_stack_fffffffffffffd80->super_DynamicProperty,in_stack_fffffffffffffd78);
  std::__cxx11::string::~string(local_80);
  std::__cxx11::string::~string(local_a0);
  std::__cxx11::stringstream::stringstream(local_228);
  poVar1 = std::operator<<(local_218,"<|Mtrans(t)-Mtrans(0)|^2>\t");
  this_00 = (TimeCorrFunc<OpenMD::Vector3<double>_> *)
            std::operator<<(poVar1,"<|Mtot(t)-Mtot(0)|^2>\t");
  std::operator<<((ostream *)this_00,"<|Mrot(t)-Mrot(0)|^2>");
  std::__cxx11::stringstream::str();
  TimeCorrFunc<OpenMD::Vector3<double>_>::setLabelString(this_00,in_stack_fffffffffffffd78);
  std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::resize
            ((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)__a,
             (size_type)__new_size,(value_type *)in_RDI);
  std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::resize
            ((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)__a,
             (size_type)__new_size,(value_type *)in_RDI);
  std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::resize
            ((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)__a,
             (size_type)__new_size,(value_type *)in_RDI);
  this_01 = (Thermo *)operator_new(8);
  Thermo::Thermo(this_01,(in_RDI->super_AutoCorrFunc<OpenMD::Vector3<double>_>).
                         super_TimeCorrFunc<OpenMD::Vector3<double>_>.info_);
  in_RDI[1].super_AutoCorrFunc<OpenMD::Vector3<double>_>.
  super_TimeCorrFunc<OpenMD::Vector3<double>_>.super_DynamicProperty._vptr_DynamicProperty =
       (_func_int **)this_01;
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffdb8);
  std::__cxx11::stringstream::~stringstream(local_228);
  return;
}

Assistant:

CollectiveDipoleDisplacement::CollectiveDipoleDisplacement(
      SimInfo* info, const string& filename, const string& sele1,
      const std::string& sele2) :
      SystemACF<Vector3d>(info, filename, sele1, sele2) {
    setCorrFuncType("Collective Dipole Displacement Function");
    setOutputName(getPrefix(dumpFilename_) + ".ddisp");

    std::stringstream label;
    label << "<|Mtrans(t)-Mtrans(0)|^2>\t"
          << "<|Mtot(t)-Mtot(0)|^2>\t"
          << "<|Mrot(t)-Mrot(0)|^2>";
    const std::string labelString = label.str();
    setLabelString(labelString);

    CRcm_.resize(nFrames_, V3Zero);
    CRtot_.resize(nFrames_, V3Zero);
    CRrot_.resize(nFrames_, V3Zero);

    // We'll need thermo to compute the volume:
    thermo_ = new Thermo(info_);
  }